

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void check_readonly(LexState *ls,expdesc *e)

{
  expkind eVar1;
  FuncState *pFVar2;
  Vardesc *pVVar3;
  TString *pTVar4;
  Upvaldesc *pUVar5;
  char *msg;
  char **ppcVar6;
  long lVar7;
  
  pFVar2 = ls->fs;
  eVar1 = e->k;
  if (eVar1 == VLOCAL) {
    pVVar3 = (pFVar2->ls->dyd->actvar).arr;
    lVar7 = (long)pFVar2->firstlocal + (ulong)(e->u).var.vidx;
    if (*(char *)((long)pVVar3 + lVar7 * 0x18 + 9) == '\0') {
      return;
    }
    pUVar5 = (Upvaldesc *)&(&pVVar3->vd)[lVar7].name;
  }
  else if (eVar1 == VUPVAL) {
    pUVar5 = pFVar2->f->upvalues;
    if (pUVar5[(e->u).info].kind == '\0') {
      return;
    }
    pUVar5 = pUVar5 + (e->u).info;
  }
  else {
    if (eVar1 != VCONST) {
      return;
    }
    pUVar5 = (Upvaldesc *)&(&((ls->dyd->actvar).arr)->vd)[(e->u).info].name;
  }
  pTVar4 = pUVar5->name;
  if (pTVar4 == (TString *)0x0) {
    return;
  }
  ppcVar6 = &pTVar4->contents;
  if (pTVar4->shrlen < '\0') {
    ppcVar6 = (char **)*ppcVar6;
  }
  msg = luaO_pushfstring(ls->L,"attempt to assign to const variable \'%s\'",ppcVar6);
  luaK_semerror(ls,msg);
}

Assistant:

static void check_readonly (LexState *ls, expdesc *e) {
  FuncState *fs = ls->fs;
  TString *varname = NULL;  /* to be set if variable is const */
  switch (e->k) {
    case VCONST: {
      varname = ls->dyd->actvar.arr[e->u.info].vd.name;
      break;
    }
    case VLOCAL: {
      Vardesc *vardesc = getlocalvardesc(fs, e->u.var.vidx);
      if (vardesc->vd.kind != VDKREG)  /* not a regular variable? */
        varname = vardesc->vd.name;
      break;
    }
    case VUPVAL: {
      Upvaldesc *up = &fs->f->upvalues[e->u.info];
      if (up->kind != VDKREG)
        varname = up->name;
      break;
    }
    default:
      return;  /* other cases cannot be read-only */
  }
  if (varname) {
    const char *msg = luaO_pushfstring(ls->L,
       "attempt to assign to const variable '%s'", getstr(varname));
    luaK_semerror(ls, msg);  /* error */
  }
}